

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yajl_encode.c
# Opt level: O2

void yajl_string_encode(yajl_print_t print,void *ctx,uchar *str,size_t len,int escape_solidus)

{
  uchar *puVar1;
  byte bVar2;
  size_t sVar3;
  long lVar4;
  char *__s;
  size_t sVar5;
  char local_54 [5];
  char local_4f;
  undefined1 local_4e;
  int local_4c;
  void *local_48;
  yajl_print_t local_40;
  uchar *local_38;
  
  builtin_strncpy(local_54,"\\u00",4);
  local_4e = 0;
  lVar4 = 0;
  local_4c = escape_solidus;
  local_48 = ctx;
  local_40 = print;
  local_38 = str;
LAB_001045bb:
  puVar1 = local_38 + lVar4;
  sVar5 = 0;
  do {
    if (len <= lVar4 + sVar5) {
      (*local_40)(local_48,(char *)puVar1,sVar5);
      return;
    }
    bVar2 = puVar1[sVar5];
    if (bVar2 == 0x2f) {
      if (local_4c != 0) {
        __s = "\\/";
        goto LAB_00104673;
      }
    }
    else {
      switch(bVar2) {
      case 8:
        __s = "\\b";
        goto LAB_00104673;
      case 9:
        __s = "\\t";
        goto LAB_00104673;
      case 10:
        __s = "\\n";
        goto LAB_00104673;
      case 0xb:
        goto switchD_001045ed_caseD_b;
      case 0xc:
        __s = "\\f";
        goto LAB_00104673;
      case 0xd:
        __s = "\\r";
        goto LAB_00104673;
      }
      if (bVar2 == 0x22) {
        __s = "\\\"";
        goto LAB_00104673;
      }
      if (bVar2 == 0x5c) {
        __s = "\\\\";
        goto LAB_00104673;
      }
switchD_001045ed_caseD_b:
      if (bVar2 < 0x20) break;
    }
    sVar5 = sVar5 + 1;
  } while( true );
  local_54[4] = "0123456789ABCDEF"[bVar2 >> 4];
  local_4f = "0123456789ABCDEF"[bVar2 & 0xf];
  __s = local_54;
LAB_00104673:
  (*print)(ctx,(char *)puVar1,sVar5);
  sVar3 = strlen(__s);
  (*print)(ctx,__s,sVar3 & 0xffffffff);
  lVar4 = lVar4 + sVar5 + 1;
  goto LAB_001045bb;
}

Assistant:

void
yajl_string_encode(const yajl_print_t print,
                   void * ctx,
                   const unsigned char * str,
                   size_t len,
                   int escape_solidus)
{
    size_t beg = 0;
    size_t end = 0;
    char hexBuf[7];
    hexBuf[0] = '\\'; hexBuf[1] = 'u'; hexBuf[2] = '0'; hexBuf[3] = '0';
    hexBuf[6] = 0;

    while (end < len) {
        const char * escaped = NULL;
        switch (str[end]) {
            case '\r': escaped = "\\r"; break;
            case '\n': escaped = "\\n"; break;
            case '\\': escaped = "\\\\"; break;
            /* it is not required to escape a solidus in JSON:
             * read sec. 2.5: http://www.ietf.org/rfc/rfc4627.txt
             * specifically, this production from the grammar:
             *   unescaped = %x20-21 / %x23-5B / %x5D-10FFFF
             */
            case '/': if (escape_solidus) escaped = "\\/"; break;
            case '"': escaped = "\\\""; break;
            case '\f': escaped = "\\f"; break;
            case '\b': escaped = "\\b"; break;
            case '\t': escaped = "\\t"; break;
            default:
                if ((unsigned char) str[end] < 32) {
                    CharToHex(str[end], hexBuf + 4);
                    escaped = hexBuf;
                }
                break;
        }
        if (escaped != NULL) {
            print(ctx, (const char *) (str + beg), end - beg);
            print(ctx, escaped, (unsigned int)strlen(escaped));
            beg = ++end;
        } else {
            ++end;
        }
    }
    print(ctx, (const char *) (str + beg), end - beg);
}